

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int read_line(lua_State *L,FILE *f)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  luaL_Buffer b;
  
  b.p = b.buffer;
  b.lvl = 0;
  b.L = L;
  while( true ) {
    __s = luaL_prepbuffer(&b);
    pcVar1 = fgets(__s,0x2000,(FILE *)f);
    if (pcVar1 == (char *)0x0) {
      luaL_pushresult(&b);
      sVar3 = lua_objlen(L,-1);
      return (uint)(sVar3 != 0);
    }
    sVar2 = strlen(__s);
    if ((sVar2 != 0) && (__s[sVar2 - 1] == '\n')) break;
    b.p = b.p + sVar2;
  }
  b.p = b.p + (sVar2 - 1);
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int read_line(lua_State*L,FILE*f){
luaL_Buffer b;
luaL_buffinit(L,&b);
for(;;){
size_t l;
char*p=luaL_prepbuffer(&b);
if(fgets(p,BUFSIZ,f)==NULL){
luaL_pushresult(&b);
return(lua_objlen(L,-1)>0);
}
l=strlen(p);
if(l==0||p[l-1]!='\n')
luaL_addsize(&b,l);
else{
luaL_addsize(&b,l-1);
luaL_pushresult(&b);
return 1;
}
}
}